

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall llvm::cl::AddLiteralOption(cl *this,Option *O,StringRef Name)

{
  CommandLineParser *this_00;
  SubCommand *pSVar1;
  void **ppvVar2;
  SmallPtrSetIteratorImpl SVar3;
  iterator iVar4;
  StringRef Name_00;
  StringRef Name_01;
  SmallPtrSetIteratorImpl local_40;
  
  this_00 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
            ::operator->((ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
                          *)this);
  if (*(int *)(this + 100) == *(int *)(this + 0x68)) {
    pSVar1 = ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)TopLevelSubCommand);
    Name_00.Length = (size_t)Name.Data;
    Name_00.Data = (char *)O;
    anon_unknown.dwarf_1408b8::CommandLineParser::addLiteralOption
              (this_00,(Option *)this,pSVar1,Name_00);
    return;
  }
  SVar3 = (SmallPtrSetIteratorImpl)
          SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                    ((SmallPtrSetImpl<llvm::cl::SubCommand_*> *)(this + 0x50));
  local_40 = SVar3;
  iVar4 = SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                    ((SmallPtrSetImpl<llvm::cl::SubCommand_*> *)(this + 0x50));
  ppvVar2 = SVar3.Bucket;
  while (ppvVar2 != iVar4.super_SmallPtrSetIteratorImpl.Bucket) {
    pSVar1 = SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                       ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_40);
    Name_01.Length = (size_t)Name.Data;
    Name_01.Data = (char *)O;
    anon_unknown.dwarf_1408b8::CommandLineParser::addLiteralOption
              (this_00,(Option *)this,pSVar1,Name_01);
    SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
              ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_40);
    ppvVar2 = local_40.Bucket;
  }
  return;
}

Assistant:

void cl::AddLiteralOption(Option &O, StringRef Name) {
  GlobalParser->addLiteralOption(O, Name);
}